

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

void __thiscall json11::anon_unknown_21::JsonParser::consume_garbage(JsonParser *this)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  bool err_ret;
  char *pcVar6;
  allocator local_51;
  string local_50;
  
  consume_whitespace(this);
  if (this->strategy == COMMENTS) {
    do {
      sVar1 = this->i;
      pcVar2 = (this->str->_M_dataplus)._M_p;
      if (pcVar2[sVar1] == '/') {
        uVar5 = sVar1 + 1;
        this->i = uVar5;
        uVar3 = this->str->_M_string_length;
        if (uVar5 == uVar3) {
          pcVar6 = "unexpected end of input after start of comment";
LAB_0015216c:
          std::__cxx11::string::string((string *)&local_50,pcVar6,&local_51);
          fail<bool>(this,&local_50,err_ret);
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_00152187;
        }
        if (pcVar2[uVar5] == '*') {
          uVar5 = sVar1 + 2;
          this->i = uVar5;
          while (uVar5 <= uVar3 - 2) {
            if ((pcVar2[uVar5] == '*') && (pcVar2[uVar5 + 1] == '/')) {
              this->i = uVar5 + 2;
              bVar4 = true;
              goto LAB_0015218a;
            }
            uVar5 = uVar5 + 1;
            this->i = uVar5;
          }
          pcVar6 = "unexpected end of input inside multi-line comment";
          goto LAB_0015216c;
        }
        if (pcVar2[uVar5] != '/') {
          pcVar6 = "malformed comment";
          goto LAB_0015216c;
        }
        uVar5 = sVar1 + 2;
        do {
          this->i = uVar5;
          bVar4 = true;
          if (uVar3 <= uVar5) break;
          pcVar6 = pcVar2 + uVar5;
          uVar5 = uVar5 + 1;
        } while (*pcVar6 != '\n');
      }
      else {
LAB_00152187:
        bVar4 = false;
      }
LAB_0015218a:
    } while ((this->failed == false) && (consume_whitespace(this), bVar4));
  }
  return;
}

Assistant:

void consume_garbage() {
      consume_whitespace();
      if(strategy == JsonParse::COMMENTS) {
        bool comment_found = false;
        do {
          comment_found = consume_comment();
          if (failed) return;
          consume_whitespace();
        }
        while(comment_found);
      }
    }